

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeweapons.cpp
# Opt level: O1

int ASigil::GiveSigilPiece(AActor *receiver)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  AWeapon *pAVar4;
  PClass *pPVar5;
  PClassActor *type;
  AInventory *this;
  ulong uVar6;
  FName local_3c;
  DVector3 local_38;
  
  iVar3 = 0;
  pAVar4 = (AWeapon *)AActor::FindInventory(receiver,(PClassActor *)RegistrationInfo.MyClass,false);
  if (pAVar4 == (AWeapon *)0x0) {
    local_3c.Index = FName::NameManager::FindName(&FName::NameData,"Sigil1",false);
    type = ClassForSpawn(&local_3c);
    local_38.X = 0.0;
    local_38.Y = 0.0;
    local_38.Z = 0.0;
    this = (AInventory *)AActor::StaticSpawn(type,&local_38,NO_REPLACE,false);
    bVar2 = AInventory::CallTryPickup(this,receiver,(AActor **)0x0);
    if (!bVar2) {
      (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(this);
    }
  }
  else {
    uVar1 = *(uint *)&pAVar4->field_0x584;
    iVar3 = 5;
    if ((int)uVar1 < 5) {
      uVar6 = 0;
      if (0 < (int)uVar1) {
        uVar6 = (ulong)uVar1;
      }
      *(uint *)&pAVar4->field_0x584 = uVar1 + 1;
      iVar3 = FName::NameManager::FindName
                        (&FName::NameData,
                         (char *)((long)&_ZZN6ASigil14GiveSigilPieceEP6AActorE6sigils_rel +
                                 (long)(int)(&_ZZN6ASigil14GiveSigilPieceEP6AActorE6sigils_rel)
                                            [uVar6]),true);
      local_38.X = (double)CONCAT44(local_38.X._4_4_,iVar3);
      pPVar5 = PClass::FindClass((FName *)&local_38);
      ((FTextureID *)((TObjPtr<AActor> *)(&(pAVar4->super_AInventory).super_AActor + 1) + 3))->
      texnum = *(int *)(pPVar5->Defaults + 0x4b8);
      if ((((((TObjPtr<AActor> *)(&(pAVar4->super_AInventory).super_AActor + 1))->field_0).p)->
           player != (player_t *)0x0) &&
         (((((TObjPtr<AActor> *)(&(pAVar4->super_AInventory).super_AActor + 1))->field_0).p)->player
          ->ReadyWeapon == pAVar4)) {
        ((pAVar4->super_AInventory).Owner.field_0.p)->player->PendingWeapon = pAVar4;
        *(int *)&pAVar4[1].super_AInventory.super_AActor.super_DThinker.super_DObject =
             *(int *)&pAVar4->field_0x584 + -1;
      }
      iVar3 = *(int *)&pAVar4->field_0x584 + -1;
    }
  }
  return iVar3;
}

Assistant:

int ASigil::GiveSigilPiece (AActor *receiver)
{
	ASigil *sigil;

	sigil = receiver->FindInventory<ASigil> ();
	if (sigil == NULL)
	{
		sigil = static_cast<ASigil*>(Spawn("Sigil1"));
		if (!sigil->CallTryPickup (receiver))
		{
			sigil->Destroy ();
		}
		return 0;
	}
	else if (sigil->NumPieces < 5)
	{
		++sigil->NumPieces;
		static const char* sigils[5] =
		{
			"Sigil1", "Sigil2", "Sigil3", "Sigil4", "Sigil5"
		};
		sigil->Icon = ((AInventory*)GetDefaultByName (sigils[MAX(0,sigil->NumPieces-1)]))->Icon;
		// If the player has the Sigil out, drop it and bring it back up.
		if (sigil->Owner->player != NULL && sigil->Owner->player->ReadyWeapon == sigil)
		{
			sigil->Owner->player->PendingWeapon = sigil;
			sigil->DownPieces = sigil->NumPieces - 1;
		}
		return sigil->NumPieces - 1;
	}
	else
	{
		return 5;
	}
}